

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3IdListDelete(sqlite3 *db,IdList *pList)

{
  int iVar1;
  long lVar2;
  IdList_item *pIVar3;
  
  if (pList != (IdList *)0x0) {
    iVar1 = pList->nId;
    if (0 < iVar1) {
      pIVar3 = pList->a;
      lVar2 = 0;
      do {
        if (pIVar3->zName != (char *)0x0) {
          sqlite3DbFreeNN(db,pIVar3->zName);
          iVar1 = pList->nId;
        }
        lVar2 = lVar2 + 1;
        pIVar3 = pIVar3 + 1;
      } while (lVar2 < iVar1);
    }
    sqlite3DbFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3IdListDelete(sqlite3 *db, IdList *pList){
  int i;
  if( pList==0 ) return;
  assert( pList->eU4!=EU4_EXPR ); /* EU4_EXPR mode is not currently used */
  for(i=0; i<pList->nId; i++){
    sqlite3DbFree(db, pList->a[i].zName);
  }
  sqlite3DbFreeNN(db, pList);
}